

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O1

void __thiscall
nn::ESoinn::trainOneEpoch
          (ESoinn *this,
          vector<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
          *points,bool train_first_layer,double threshold_second_layer,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *labels)

{
  uint uVar1;
  Point *p;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  ConcreteLogger *pCVar5;
  pointer puVar6;
  pointer puVar7;
  int iVar8;
  ulong uVar9;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long local_1a8;
  undefined1 local_1a0 [224];
  put_holder<char,_std::char_traits<char>_> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  double local_a0;
  string_type local_98;
  string local_78;
  pointer puStack_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> order;
  uint local_34 [2];
  uint32_t iteration;
  
  pCVar5 = log_netw;
  local_1a0._0_8_ = local_1a0 + 0x10;
  local_a8 = labels;
  local_a0 = threshold_second_layer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"trainOneEpoch function","");
  logger::ConcreteLogger::debug(pCVar5,(string *)local_1a0,false);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_);
  }
  puStack_58 = (pointer)0x0;
  order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffff00000000;
  if ((points->
      super__Vector_base<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (points->
      super__Vector_base<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar9 = 0;
    do {
      if (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&puStack_58,
                   (iterator)
                   order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,(uint *)local_1a0);
      }
      else {
        *order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start = (uint)uVar9;
        order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      uVar9 = (ulong)(local_1a0._0_4_ + 1);
      local_1a0._0_4_ = local_1a0._0_4_ + 1;
    } while (uVar9 < (ulong)((long)(points->
                                   super__Vector_base<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(points->
                                   super__Vector_base<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  puVar7 = order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar6 = puStack_58;
  if ((puStack_58 !=
       order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (puStack_58 + 1 !=
      order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    lVar13 = 4;
    do {
      iVar8 = rand();
      lVar11 = (long)iVar8 % ((lVar13 >> 2) + 1);
      if (lVar13 != lVar11 * 4) {
        uVar1 = *(uint *)((long)puVar6 + lVar13);
        *(uint *)((long)puVar6 + lVar13) = puVar6[lVar11];
        puVar6[lVar11] = uVar1;
      }
      lVar11 = lVar13 + 4;
      lVar13 = lVar13 + 4;
    } while ((pointer)((long)puVar6 + lVar11) != puVar7);
  }
  local_34[0] = 1;
  if (order.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != puStack_58) {
    uVar9 = 0;
    uVar12 = 1;
    do {
      uVar1 = puStack_58[uVar9];
      p = (points->
          super__Vector_base<std::shared_ptr<wv::AbstractWeightVector>,_std::allocator<std::shared_ptr<wv::AbstractWeightVector>_>_>
          )._M_impl.super__Vector_impl_data._M_start[uVar1].
          super___shared_ptr<wv::AbstractWeightVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pbVar2 = (local_a8->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pbVar2 == (local_a8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"0","");
      }
      else {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar3 = pbVar2[uVar1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar3,pcVar3 + pbVar2[uVar1]._M_string_length);
      }
      processNewPoint(this,p,&local_78,train_first_layer,local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      pCVar5 = log_netw;
      if (local_34[0] % this->m_Lambda == 0) {
        local_1a0._0_8_ = local_1a0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"iteration multiple lambda","");
        logger::ConcreteLogger::debug(pCVar5,(string *)local_1a0,false);
        if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
          operator_delete((void *)local_1a0._0_8_);
        }
        updateClassLabels(this);
        deleteEdgesDiffClasses(this);
        deleteNodes(this);
      }
      pCVar5 = log_netw;
      if ((local_34[0] * 0x3afb7e91 >> 4 | local_34[0] * 0x10000000) < 0x68db9) {
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   "Iteration %d");
        local_c0.arg = local_34;
        local_c0.put_head =
             boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_int>;
        local_c0.put_last =
             boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_int>;
        pbVar10 = boost::io::detail::
                  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1a0,&local_c0);
        boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                  (&local_98,pbVar10);
        logger::ConcreteLogger::info(pCVar5,&local_98,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if (local_1a0[0xd0] == true) {
          std::locale::~locale((locale *)(local_1a0 + 0xd8));
          local_1a0[0xd0] = false;
        }
        boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_altstringbuf((basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)(local_1a0 + 0x78));
        if ((undefined1 *)local_1a0._80_8_ != local_1a0 + 0x60) {
          operator_delete((void *)local_1a0._80_8_);
        }
        if ((void *)local_1a0._24_8_ != (void *)0x0) {
          operator_delete((void *)local_1a0._24_8_);
          local_1a0._24_8_ = (void *)0x0;
          local_1a0._32_4_ = 0;
          local_1a0._40_8_ = (_Bit_type *)0x0;
          local_1a0._48_4_ = 0;
          local_1a0._56_8_ = (_Bit_pointer)0x0;
        }
        std::
        vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1a0);
      }
      local_34[0] = local_34[0] + 1;
      bVar4 = uVar12 < (ulong)((long)order.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)puStack_58 >>
                              2);
      uVar9 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar4);
  }
  deleteNodes(this);
  SealNeuronVector(this);
  pCVar5 = log_netw;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
             "Network size = %d, number of empty neurons = %d");
  local_1a8 = ((long)(this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
  local_c0.arg = &local_1a8;
  local_c0.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_long_const>;
  local_c0.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_long_const>;
  pbVar10 = boost::io::detail::
            feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a0,&local_c0);
  local_c0.arg = &this->m_NumEmptyNeurons;
  local_c0.put_head = boost::io::detail::call_put_head<char,std::char_traits<char>,unsigned_int>;
  local_c0.put_last = boost::io::detail::call_put_last<char,std::char_traits<char>,unsigned_int>;
  pbVar10 = boost::io::detail::
            feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                      (pbVar10,&local_c0);
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (&local_98,pbVar10);
  logger::ConcreteLogger::info(pCVar5,&local_98,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_1a0[0xd0] == true) {
    std::locale::~locale((locale *)(local_1a0 + 0xd8));
    local_1a0[0xd0] = false;
  }
  boost::io::basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_>::
  ~basic_altstringbuf((basic_altstringbuf<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_1a0 + 0x78));
  if ((undefined1 *)local_1a0._80_8_ != local_1a0 + 0x60) {
    operator_delete((void *)local_1a0._80_8_);
  }
  if ((void *)local_1a0._24_8_ != (void *)0x0) {
    operator_delete((void *)local_1a0._24_8_);
    local_1a0._24_8_ = (void *)0x0;
    local_1a0._32_4_ = 0;
    local_1a0._40_8_ = (_Bit_type *)0x0;
    local_1a0._48_4_ = 0;
    local_1a0._56_8_ = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a0);
  if (puStack_58 != (pointer)0x0) {
    operator_delete(puStack_58);
  }
  return;
}

Assistant:

void ESoinn::trainOneEpoch(const std::vector<std::shared_ptr<wv::Point>>& points, bool train_first_layer, double threshold_second_layer, const std::vector<std::string>& labels)
    {
        log_netw->debug("trainOneEpoch function");
        //create vector with order of iterating by points
        std::vector<uint32_t> order;
        for (uint32_t i = 0; i < points.size(); i++)
            order.push_back(i);
        
        std::random_shuffle(order.begin(), order.end());
        uint32_t iteration = 1;

        for (uint32_t i = 0; i < order.size(); i++)
        {
            processNewPoint(points[order[i]].get(), (labels.empty()) ? "0" : labels[order[i]], train_first_layer, threshold_second_layer);
            if (iteration % m_Lambda == 0)
            {
                log_netw->debug("iteration multiple lambda");
                updateClassLabels();
                deleteEdgesDiffClasses();
                deleteNodes();
            }
            if (iteration % 10000 == 0)
                log_netw->info((boost::format("Iteration %d") % iteration).str());
            iteration++;
        }
        deleteNodes();
        SealNeuronVector();
        
        log_netw->info((boost::format("Network size = %d, number of empty neurons = %d") % m_Neurons.size() % m_NumEmptyNeurons).str());
    }